

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int maxsampleindex;
  int streamType;
  int extraout_EDX;
  sigaction sa;
  string local_108;
  string local_e8;
  sigaction local_c8;
  
  maxsampleindex = -1;
  streamType = 2;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"vhS:t:");
      if (iVar1 != 0x53) break;
      maxsampleindex = atoi(_optarg);
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x74) {
      if (iVar1 == 0x76) {
        main_cold_1();
      }
      main_cold_5();
LAB_00101737:
      main_cold_4();
LAB_0010173c:
      main_cold_3();
      if (extraout_EDX == 1) {
        main_cold_2();
      }
      _Unwind_Resume();
    }
    streamType = atoi(_optarg);
  }
  progname = *argv;
  memset(&local_c8,0,0x98);
  sigemptyset(&local_c8.sa_mask);
  local_c8.__sigaction_handler.sa_handler = segfault_sigaction;
  local_c8.sa_flags = 4;
  sigaction(0xb,&local_c8,(sigaction *)0x0);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  initstreams(&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (maxsampleindex == -1) goto LAB_00101737;
  if (0xfffffffd < streamType - 3U) {
    gultobin::doit(maxsampleindex,streamType);
    return 0;
  }
  goto LAB_0010173c;
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	int maxsampleindex = -1;
	int streamType = 2;
	while ((opt = getopt(argc, argv, "vhS:t:")) != -1) {
		switch (opt) {
		case 'S':
			maxsampleindex = atoi(optarg);
			break;
		case 't':
			streamType = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
		if (maxsampleindex == -1) {
			fprintf(stderr, "FATAL: Sample size not supplied - please use -S parameter followed by the sample size\n");
			exit(EXIT_FAILURE);
		}
		if (streamType != 1 && streamType != 2) {
			fprintf(stderr, "FATAL: Unknown stream type %d - please use 1 for item stream or 2 for loss stream\n", streamType);
			exit(EXIT_FAILURE);
		}
		gultobin::doit(maxsampleindex, streamType);

		return EXIT_SUCCESS;
	}catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}